

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O1

void duckdb_brotli::DecodeCommandBlockSwitch(BrotliDecoderStateInternal *s)

{
  uint64_t *puVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ulong uVar5;
  long *plVar6;
  uint *puVar7;
  HuffmanCode *pHVar8;
  ulong uVar9;
  HuffmanCode *pHVar10;
  uint64_t uVar11;
  ulong uVar12;
  
  uVar5 = s->num_block_types[1];
  if (1 < uVar5) {
    pHVar10 = s->block_type_trees;
    uVar9 = (s->br).bit_pos_;
    if (uVar9 < 0x11) {
      plVar6 = (long *)(s->br).next_in;
      (s->br).val_ = (s->br).val_ | *plVar6 << ((byte)uVar9 & 0x3f);
      (s->br).bit_pos_ = uVar9 + 0x30;
      (s->br).next_in = (uint8_t *)((long)plVar6 + 6);
    }
    uVar9 = (s->br).val_;
    pHVar10 = pHVar10 + (uVar9 & 0xff) + 0x278;
    bVar2 = pHVar10->bits;
    if (8 < bVar2) {
      puVar1 = &(s->br).bit_pos_;
      *puVar1 = *puVar1 - 8;
      uVar9 = uVar9 >> 8;
      (s->br).val_ = uVar9;
      pHVar10 = pHVar10 + (uVar9 & *(ulong *)(kBrotliBitMask + (ulong)(bVar2 - 8) * 8)) +
                          (ulong)pHVar10->value;
    }
    pHVar8 = s->block_len_trees;
    uVar9 = (s->br).bit_pos_ - (ulong)pHVar10->bits;
    uVar12 = (s->br).val_ >> (pHVar10->bits & 0x3f);
    (s->br).bit_pos_ = uVar9;
    (s->br).val_ = uVar12;
    uVar3 = pHVar10->value;
    if (uVar9 < 0x11) {
      plVar6 = (long *)(s->br).next_in;
      (s->br).val_ = *plVar6 << ((byte)uVar9 & 0x3f) | uVar12;
      (s->br).bit_pos_ = uVar9 + 0x30;
      (s->br).next_in = (uint8_t *)((long)plVar6 + 6);
    }
    uVar9 = (s->br).val_;
    pHVar8 = pHVar8 + (uVar9 & 0xff) + 0x18c;
    bVar2 = pHVar8->bits;
    if (8 < bVar2) {
      puVar1 = &(s->br).bit_pos_;
      *puVar1 = *puVar1 - 8;
      uVar9 = uVar9 >> 8;
      (s->br).val_ = uVar9;
      pHVar8 = pHVar8 + (uVar9 & *(ulong *)(kBrotliBitMask + (ulong)(bVar2 - 8) * 8)) +
                        (ulong)pHVar8->value;
    }
    uVar12 = (s->br).val_ >> (pHVar8->bits & 0x3f);
    uVar9 = (s->br).bit_pos_ - (ulong)pHVar8->bits;
    (s->br).bit_pos_ = uVar9;
    (s->br).val_ = uVar12;
    bVar2 = _kBrotliPrefixCodeRanges[(ulong)pHVar8->value * 4 + 2];
    uVar4 = *(ushort *)(_kBrotliPrefixCodeRanges + (ulong)pHVar8->value * 4);
    if (uVar9 < 0x21) {
      puVar7 = (uint *)(s->br).next_in;
      (s->br).val_ = (ulong)*puVar7 << ((byte)uVar9 & 0x3f) | uVar12;
      (s->br).bit_pos_ = uVar9 + 0x20;
      (s->br).next_in = (uint8_t *)(puVar7 + 1);
    }
    uVar9 = (s->br).val_;
    uVar12 = *(ulong *)(kBrotliBitMask + (ulong)bVar2 * 8);
    puVar1 = &(s->br).bit_pos_;
    *puVar1 = *puVar1 - (ulong)bVar2;
    (s->br).val_ = uVar9 >> (bVar2 & 0x3f);
    s->block_length[1] = (uVar12 & uVar9) + (ulong)uVar4;
    if ((ulong)uVar3 == 0) {
      uVar11 = s->block_type_rb[2];
    }
    else if (uVar3 == 1) {
      uVar11 = s->block_type_rb[3] + 1;
    }
    else {
      uVar11 = (ulong)uVar3 - 2;
    }
    uVar9 = 0;
    if (uVar5 <= uVar11) {
      uVar9 = uVar5;
    }
    s->block_type_rb[2] = s->block_type_rb[3];
    s->block_type_rb[3] = uVar11 - uVar9;
    if (1 < uVar5) {
      s->htree_command = (s->insert_copy_hgroup).htrees[s->block_type_rb[3]];
    }
  }
  return;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(int safe, BrotliDecoderState *s, int tree_type) {
	brotli_reg_t max_block_type = s->num_block_types[tree_type];
	const HuffmanCode *type_tree = &s->block_type_trees[tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
	const HuffmanCode *len_tree = &s->block_len_trees[tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
	BrotliBitReader *br = &s->br;
	brotli_reg_t *ringbuffer = &s->block_type_rb[tree_type * 2];
	brotli_reg_t block_type;
	if (max_block_type <= 1) {
		return BROTLI_FALSE;
	}

	/* Read 0..15 + 3..39 bits. */
	if (!safe) {
		block_type = ReadSymbol(type_tree, br);
		s->block_length[tree_type] = ReadBlockLength(len_tree, br);
	} else {
		BrotliBitReaderState memento;
		BrotliBitReaderSaveState(br, &memento);
		if (!SafeReadSymbol(type_tree, br, &block_type))
			return BROTLI_FALSE;
		if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
			s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
			BrotliBitReaderRestoreState(br, &memento);
			return BROTLI_FALSE;
		}
	}

	if (block_type == 1) {
		block_type = ringbuffer[1] + 1;
	} else if (block_type == 0) {
		block_type = ringbuffer[0];
	} else {
		block_type -= 2;
	}
	if (block_type >= max_block_type) {
		block_type -= max_block_type;
	}
	ringbuffer[0] = ringbuffer[1];
	ringbuffer[1] = block_type;
	return BROTLI_TRUE;
}